

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DaTrie.hpp
# Opt level: O0

void __thiscall
ddd::DaTrie<false,_true,_true>::insert_edge_(DaTrie<false,_true,_true> *this,Query *query)

{
  byte bVar1;
  bool bVar2;
  uint8_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint uVar6;
  reference pvVar7;
  reference pvVar8;
  Query *in_RSI;
  vector<ddd::Bc,_std::allocator<ddd::Bc>_> *in_RDI;
  uint32_t _child_pos;
  uint32_t child_pos;
  Query *in_stack_00000288;
  DaTrie<false,_true,_true> *in_stack_00000290;
  uint32_t node_pos;
  Query *this_00;
  undefined2 in_stack_ffffffffffffffd0;
  undefined1 in_stack_ffffffffffffffd2;
  undefined1 in_stack_ffffffffffffffd3;
  uint32_t in_stack_ffffffffffffffd4;
  undefined4 in_stack_ffffffffffffffe0;
  uint local_14;
  
  uVar4 = Query::node_pos(in_RSI);
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar4);
  uVar4 = Bc::base(pvVar7);
  bVar1 = Query::label(in_RSI);
  local_14 = uVar4 ^ bVar1;
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)local_14);
  bVar2 = Bc::is_fixed(pvVar7);
  if (bVar2) {
    solve_(in_stack_00000290,in_stack_00000288);
    uVar5 = Query::node_pos(in_RSI);
    pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar5);
    in_stack_ffffffffffffffd4 = Bc::base(pvVar7);
    bVar1 = Query::label(in_RSI);
    local_14 = in_stack_ffffffffffffffd4 ^ bVar1;
  }
  fix_((DaTrie<false,_true,_true> *)CONCAT44(uVar4,in_stack_ffffffffffffffe0),
       (uint32_t)((ulong)in_RDI >> 0x20),
       (vector<ddd::Block,_std::allocator<ddd::Block>_> *)
       CONCAT44(in_stack_ffffffffffffffd4,
                CONCAT13(in_stack_ffffffffffffffd3,
                         CONCAT12(in_stack_ffffffffffffffd2,in_stack_ffffffffffffffd0))));
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)local_14);
  uVar4 = Query::node_pos(in_RSI);
  Bc::set_check(pvVar7,uVar4);
  node_pos = (uint32_t)((ulong)pvVar7 >> 0x20);
  uVar4 = Query::node_pos(in_RSI);
  pvVar7 = std::vector<ddd::Bc,_std::allocator<ddd::Bc>_>::operator[](in_RDI,(ulong)uVar4);
  uVar4 = Bc::base(pvVar7);
  this_00 = (Query *)(in_RDI + 3);
  uVar5 = Query::node_pos(in_RSI);
  pvVar8 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                     ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)this_00,(ulong)uVar5)
  ;
  uVar6 = uVar4 ^ pvVar8->child;
  pvVar8 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                     ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                      (ulong)uVar6);
  uVar3 = pvVar8->sib;
  pvVar8 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                     ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                      (ulong)local_14);
  pvVar8->sib = uVar3;
  uVar3 = Query::label(in_RSI);
  pvVar8 = std::vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_>::operator[]
                     ((vector<ddd::NodeLink,_std::allocator<ddd::NodeLink>_> *)(in_RDI + 3),
                      (ulong)uVar6);
  pvVar8->sib = uVar3;
  Query::next(this_00,node_pos);
  return;
}

Assistant:

void insert_edge_(Query& query) {
    assert(query.node_pos() < bc_.size());
    assert(bc_[query.node_pos()].is_fixed());

    auto child_pos = bc_[query.node_pos()].base() ^query.label();

    if (bc_[child_pos].is_fixed()) {
      solve_(query);
      child_pos = bc_[query.node_pos()].base() ^ query.label();
    }

    fix_(child_pos, blocks_);
    bc_[child_pos].set_check(query.node_pos());

    if (WithNLM) {
      auto _child_pos = bc_[query.node_pos()].base() ^node_links_[query.node_pos()].child;
      node_links_[child_pos].sib = node_links_[_child_pos].sib;
      node_links_[_child_pos].sib = query.label();
    }
    query.next(child_pos);
  }